

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::MembraneHook::wrap(MembraneHook *this,ClientHook *cap,MembranePolicy *policy,bool reverse)

{
  RawBrandedSchema *pRVar1;
  ClientHook *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  Entry *pEVar6;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar7;
  ClientHook *extraout_RDX_02;
  Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
  *table;
  Own<capnp::ClientHook,_std::nullptr_t> OVar8;
  Own<capnp::ClientHook,_std::nullptr_t> local_c8;
  Own<capnp::ClientHook,_std::nullptr_t> local_b8;
  Own<capnp::ClientHook,_std::nullptr_t> local_a8;
  Disposer *local_98;
  ClientHook *local_90;
  Own<capnp::ClientHook,_std::nullptr_t> local_88;
  Own<capnp::ClientHook,_std::nullptr_t> local_78;
  Own<capnp::ClientHook,_std::nullptr_t> local_60;
  Own<capnp::ClientHook,_std::nullptr_t> local_50;
  Own<capnp::ClientHook,_std::nullptr_t> local_40;
  long *plVar4;
  
  if ((undefined1 *)cap->brand == &(anonymous_namespace)::DUMMY) {
    iVar3 = (*policy->_vptr_MembranePolicy[8])(policy);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    plVar5 = (long *)(**(code **)(*cap[3].brand + 0x40))();
    if ((plVar5 == plVar4) && ((bool)*(char *)&cap[4]._vptr_ClientHook == !reverse)) {
      (**(code **)(*cap[2].brand + 0x20))(&local_40);
      local_90 = local_40.ptr;
      local_98 = local_40.disposer;
      local_c8.disposer = local_40.disposer;
      local_40.ptr = (ClientHook *)0x0;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_40);
      if (reverse) {
        local_c8.ptr = (ClientHook *)0x0;
        local_50.disposer = local_98;
        local_50.ptr = local_90;
        (**(code **)(*plVar4 + 0x48))(&local_a8,plVar4,&local_50,cap[3].brand,policy);
      }
      else {
        local_c8.ptr = (ClientHook *)0x0;
        local_60.disposer = local_98;
        local_60.ptr = local_90;
        (**(code **)(*plVar4 + 0x50))(&local_a8,plVar4,&local_60,cap[3].brand,policy);
      }
      (this->super_ClientHook)._vptr_ClientHook = (_func_int **)local_a8.disposer;
      (this->super_ClientHook).brand = local_a8.ptr;
      local_a8.ptr = (ClientHook *)0x0;
      if (reverse) {
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_a8);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_50);
      }
      else {
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_a8);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_60);
      }
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_c8);
      pCVar7 = extraout_RDX_02;
      goto LAB_002b1492;
    }
  }
  table = &(policy->wrappers).table;
  if (reverse) {
    table = &(policy->reverseWrappers).table;
  }
  local_c8.disposer = (Disposer *)cap;
  local_40.disposer = (Disposer *)cap;
  pEVar6 = kj::
           Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
           ::
           FindOrCreateImpl<capnp::MembraneHook::wrap(capnp::ClientHook&,capnp::MembranePolicy&,bool)::{lambda()#1},capnp::ClientHook*&>
           ::apply<0ul>(table,(ClientHook **)&local_c8,(anon_class_8_1_ba1d3b32_conflict *)&local_40
                       );
  pRVar1 = (pEVar6->value).super_Schema.raw;
  if (pRVar1 == (RawBrandedSchema *)0x0) {
    if (reverse) {
      (*cap->_vptr_ClientHook[4])(&local_c8,cap);
      local_78.disposer._0_4_ = local_c8.disposer._0_4_;
      local_78.disposer._4_4_ = local_c8.disposer._4_4_;
      local_78.ptr._0_4_ = local_c8.ptr._0_4_;
      local_78.ptr._4_4_ = local_c8.ptr._4_4_;
      local_c8.ptr = (ClientHook *)0x0;
      (*policy->_vptr_MembranePolicy[6])(&local_b8,policy);
    }
    else {
      (*cap->_vptr_ClientHook[4])(&local_c8,cap);
      local_88.disposer._0_4_ = local_c8.disposer._0_4_;
      local_88.disposer._4_4_ = local_c8.disposer._4_4_;
      local_88.ptr._0_4_ = local_c8.ptr._0_4_;
      local_88.ptr._4_4_ = local_c8.ptr._4_4_;
      local_c8.ptr = (ClientHook *)0x0;
      (*policy->_vptr_MembranePolicy[7])(&local_b8,policy);
    }
    pCVar2 = local_b8.ptr;
    (this->super_ClientHook)._vptr_ClientHook = (_func_int **)local_b8.disposer;
    (this->super_ClientHook).brand = local_b8.ptr;
    local_b8.ptr = (ClientHook *)0x0;
    if (reverse) {
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_b8);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_78);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_c8);
      pCVar7 = extraout_RDX_00;
    }
    else {
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_b8);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_88);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_c8);
      pCVar7 = extraout_RDX_01;
    }
    (pEVar6->value).super_Schema.raw = (RawBrandedSchema *)pCVar2;
  }
  else {
    (*(code *)pRVar1->generic->membersByName)(this);
    pCVar7 = extraout_RDX;
  }
LAB_002b1492:
  OVar8.ptr = pCVar7;
  OVar8.disposer = (Disposer *)this;
  return OVar8;
}

Assistant:

static kj::Own<ClientHook> wrap(ClientHook& cap, MembranePolicy& policy, bool reverse) {
    if (cap.isBrand(MEMBRANE_BRAND)) {
      auto& otherMembrane = kj::downcast<MembraneHook>(cap);
      auto& rootPolicy = policy.rootPolicy();
      if (&otherMembrane.policy->rootPolicy() == &rootPolicy &&
          otherMembrane.reverse == !reverse) {
        // Capability that passed across the membrane one way is now passing back the other way.
        // Unwrap it rather than double-wrap it.
        Capability::Client unwrapped(otherMembrane.inner->addRef());
        return ClientHook::from(
            reverse ? rootPolicy.importInternal(kj::mv(unwrapped), *otherMembrane.policy, policy)
                    : rootPolicy.exportExternal(kj::mv(unwrapped), *otherMembrane.policy, policy));
      }
    }

    auto& map = reverse ? policy.reverseWrappers : policy.wrappers;
    ClientHook*& slot = map.findOrCreate(&cap, [&]() -> kj::Decay<decltype(map)>::Entry {
      return { &cap, nullptr };
    });
    if (slot == nullptr) {
      auto result = ClientHook::from(
          reverse ? policy.importExternal(Capability::Client(cap.addRef()))
                  : policy.exportInternal(Capability::Client(cap.addRef())));
      slot = result;
      return result;
    } else {
      return slot->addRef();
    }
  }